

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t HUF_estimateCompressedSize(HUF_CElt *CTable,uint *count,uint maxSymbolValue)

{
  ulong uVar1;
  ulong uVar2;
  
  if (-1 < (int)maxSymbolValue) {
    uVar2 = 0;
    uVar1 = 0;
    do {
      uVar1 = uVar1 + (ulong)count[uVar2] * (ulong)(byte)CTable[uVar2 + 1];
      uVar2 = uVar2 + 1;
    } while (maxSymbolValue + 1 != uVar2);
    return uVar1 >> 3;
  }
  return 0;
}

Assistant:

size_t HUF_estimateCompressedSize(const HUF_CElt* CTable, const unsigned* count, unsigned maxSymbolValue)
{
    HUF_CElt const* ct = CTable + 1;
    size_t nbBits = 0;
    int s;
    for (s = 0; s <= (int)maxSymbolValue; ++s) {
        nbBits += HUF_getNbBits(ct[s]) * count[s];
    }
    return nbBits >> 3;
}